

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpg_tools.cc
# Opt level: O3

vector<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_> *
projects::dpg::BoundaryQuadRule
          (vector<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_> *__return_storage_ptr__,
          RefEl ref_el,QuadRule *qr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double *pdVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  double *pdVar4;
  double dVar5;
  RefEl ref_el_00;
  long *plVar6;
  _Alloc_hider lhs;
  size_type rhs;
  undefined8 uVar7;
  size_type sVar8;
  MatrixXd *pMVar9;
  Matrix<double,__1,_1,_0,__1,_1> *src;
  ostream *poVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  Matrix<double,__1,_1,_0,__1,_1> *other;
  vector<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_> *BoundaryQuadRules;
  VectorXd Weights;
  MatrixXd Points;
  stringstream ss;
  RefEl local_2c2;
  assign_op<double,_double> local_2c1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2c0;
  string local_2b8;
  vector<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_> *local_298;
  long *local_290;
  string local_288;
  DenseStorage<double,__1,__1,_1,_0> local_268;
  string local_258;
  TriaO1 *local_238;
  ulong local_230;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_228;
  VectorXd *local_210;
  MatrixXd *local_208;
  ulong local_200;
  Scalar local_1f8;
  DenseStorage<double,__1,__1,_1,_0> local_1f0;
  Rhs local_1e0;
  DenseStorage<double,__1,__1,__1,_0> local_1d0;
  undefined1 local_1b8 [32];
  double *local_198;
  
  local_2c2.type_ = ref_el.type_;
  local_298 = __return_storage_ptr__;
  if (ref_el.type_ == kQuad) {
    local_2b8._M_dataplus._M_p._0_1_ = 4;
    pMVar9 = lf::base::RefEl::NodeCoords((RefEl *)&local_2b8);
    local_1b8._0_8_ = (TriaO1 *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<lf::geometry::QuadO1,std::allocator<lf::geometry::QuadO1>,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8),(QuadO1 **)local_1b8,
               (allocator<lf::geometry::QuadO1> *)&local_258,pMVar9);
  }
  else {
    if (ref_el.type_ != kTria) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      poVar10 = lf::base::operator<<((ostream *)(local_1b8 + 0x10),&local_2c2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,"unsupported reference element.",0x1e);
      paVar3 = &local_258.field_2;
      local_258._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"false","");
      paVar1 = &local_2b8.field_2;
      local_2b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/dpg_tools.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      lf::base::AssertionFailed(&local_258,&local_2b8,0x1b,&local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar3) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      local_258._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"false","");
      local_2b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/dpg_tools.cc"
                 ,"");
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"");
      lf::base::AssertionFailed(&local_258,&local_2b8,0x1b,&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_258);
      abort();
    }
    local_2b8._M_dataplus._M_p._0_1_ = 3;
    pMVar9 = lf::base::RefEl::NodeCoords((RefEl *)&local_2b8);
    local_1b8._0_8_ = (TriaO1 *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<lf::geometry::TriaO1,std::allocator<lf::geometry::TriaO1>,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8),(TriaO1 **)local_1b8,
               (allocator<lf::geometry::TriaO1> *)&local_258,pMVar9);
  }
  uVar7 = local_1b8._8_8_;
  local_238 = (TriaO1 *)local_1b8._0_8_;
  sVar8 = lf::base::RefEl::NumSubEntities(&local_2c2,1);
  local_2c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
  local_200 = (ulong)sVar8;
  std::vector<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>::vector
            (local_298,local_200,(allocator_type *)local_1b8);
  if (sVar8 != 0) {
    local_208 = &qr->points_;
    local_210 = &qr->weights_;
    uVar12 = 0;
    do {
      local_230 = uVar12;
      (*(local_238->super_Geometry)._vptr_Geometry[7])(&local_290,local_238,1);
      (**(code **)(*local_290 + 0x18))(&local_258,local_290,local_208);
      plVar6 = local_290;
      local_228.m_storage.m_data = (double *)0x0;
      local_228.m_storage.m_rows = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_228,1);
      local_1f8 = 0.5;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
                ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1b8,
                 (Matrix<double,__1,_1,_0,__1,_1> *)&local_228,&local_1f8);
      src = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
                      ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1b8);
      local_2b8._M_dataplus._M_p = (pointer)0x0;
      local_2b8._M_string_length = 0;
      local_2b8.field_2._M_allocated_capacity = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_2b8,
                 (src->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows,1);
      pdVar4 = (src->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,double,double>
                ((Matrix<double,__1,__1,_0,__1,__1> *)&local_2b8,src,
                 (assign_op<double,_double> *)&local_288);
      lVar11 = local_2b8.field_2._M_allocated_capacity * local_2b8._M_string_length;
      uVar12 = lVar11 - (lVar11 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < lVar11) {
        lVar13 = 0;
        do {
          pdVar2 = pdVar4 + lVar13;
          dVar5 = pdVar2[1];
          *(double *)(local_2b8._M_dataplus._M_p + lVar13 * 8) = *pdVar2;
          *(double *)((long)(local_2b8._M_dataplus._M_p + lVar13 * 8) + 8) = dVar5;
          lVar13 = lVar13 + 2;
        } while (lVar13 < (long)uVar12);
      }
      if ((long)uVar12 < lVar11) {
        do {
          *(double *)(local_2b8._M_dataplus._M_p + uVar12 * 8) = pdVar4[uVar12];
          uVar12 = uVar12 + 1;
        } while (lVar11 - uVar12 != 0);
      }
      (**(code **)(*plVar6 + 0x30))(&local_1e0,plVar6,&local_2b8);
      Eigen::
      Product<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
      Product((Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
               *)&local_288,local_210,&local_1e0);
      rhs = local_288._M_string_length;
      lhs._M_p = local_288._M_dataplus._M_p;
      local_268.m_data = (double *)0x0;
      local_268.m_rows = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_268,
                 *(Index *)(local_288._M_dataplus._M_p + 8),1);
      lVar11 = *(long *)(lhs._M_p + 8);
      if (local_268.m_rows != lVar11) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_268,lVar11,1);
      }
      Eigen::
      Product<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
      Product((Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
               *)&local_288,(Lhs *)lhs._M_p,(Rhs *)rhs);
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,_1,_0,__1,_1> *)&local_268,
                 (Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                  *)&local_288,&local_2c1);
      free(local_1e0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          );
      free(local_2b8._M_dataplus._M_p);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
                ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1b8);
      free(local_228.m_storage.m_data);
      ref_el_00.type_ = local_2c2.type_;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                (&local_1d0,(DenseStorage<double,__1,__1,__1,_0> *)&local_258);
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_1f0,&local_268);
      lf::quad::QuadRule::QuadRule
                ((QuadRule *)local_1b8,ref_el_00,(MatrixXd *)&local_1d0,(VectorXd *)&local_1f0,0);
      free(local_1f0.m_data);
      free(local_1d0.m_data);
      lf::quad::QuadRule::operator=
                ((local_298->
                 super__Vector_base<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>).
                 _M_impl.super__Vector_impl_data._M_start + local_230,(QuadRule *)local_1b8);
      free(local_198);
      free((void *)local_1b8._8_8_);
      free(local_268.m_data);
      free(local_258._M_dataplus._M_p);
      if (local_290 != (long *)0x0) {
        (**(code **)(*local_290 + 0x58))();
      }
      uVar12 = local_230 + 1;
    } while (uVar12 != local_200);
  }
  if (local_2c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c0);
  }
  return local_298;
}

Assistant:

std::vector<lf::quad::QuadRule> BoundaryQuadRule(lf::base::RefEl ref_el,
                                                 const lf::quad::QuadRule& qr) {
  // construct the geometry of the reference element
  std::shared_ptr<lf::geometry::Geometry> geo_ptr;
  switch (ref_el) {
    case (lf::base::RefEl::kTria()):
      geo_ptr = std::make_shared<lf::geometry::TriaO1>(
          lf::base::RefEl::kTria().NodeCoords());
      break;
    case (lf::base::RefEl::kQuad()):
      geo_ptr = std::make_shared<lf::geometry::QuadO1>(
          lf::base::RefEl::kQuad().NodeCoords());
      break;
    default:
      LF_ASSERT_MSG(false, ref_el << "unsupported reference element.");
  }

  // query the number of edges
  const lf::base::size_type numSegments = ref_el.NumSubEntities(1);
  std::vector<lf::quad::QuadRule> BoundaryQuadRules(numSegments);

  // iterate over edges
  for (int segment = 0; segment < numSegments; ++segment) {
    // query edge geometry and transform weights
    auto edge_ptr = geo_ptr->SubGeometry(1, segment);
    const Eigen::MatrixXd Points = edge_ptr->Global(qr.Points());
    const Eigen::VectorXd Weights =
        qr.Weights() *
        edge_ptr->IntegrationElement((Eigen::VectorXd(1) << 0.5).finished());
    const lf::quad::QuadRule bqr(ref_el, Points, Weights, 0);
    BoundaryQuadRules[segment] = bqr;
  }

  return BoundaryQuadRules;
}